

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O0

void get_msurf_descriptor_simd_2_24_unconditional(integral_image *iimage,interest_point *ipoint)

{
  undefined1 auVar1 [32];
  float fVar2;
  __m256i scale_00;
  __m256i scale_01;
  __m256i scale_02;
  __m256i scale_03;
  __m256i scale_04;
  __m256i scale_05;
  undefined1 auVar3 [32];
  __m256i col;
  __m256i col_00;
  __m256i col_01;
  __m256i col_02;
  __m256i col_03;
  __m256i col_04;
  undefined1 auVar4 [32];
  __m256i row;
  __m256i row_00;
  __m256i row_01;
  __m256i row_02;
  __m256i row_03;
  __m256i row_04;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float *in_RSI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar36 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int i_1;
  float norm_factor;
  float d4;
  float d3;
  float d2;
  float d1;
  float gauss_s2;
  float rry;
  float rrx;
  float ry;
  float rx;
  float gauss_s1;
  float gauss_s1_x;
  int k;
  int gauss_index_k;
  float gauss_s1_y;
  int l_1;
  int gauss_index_l_inc;
  int gauss_index_l;
  float mdy;
  float mdx;
  float dy;
  float dx;
  float *j_arr;
  int j;
  int gauss_index_k_inc;
  int gauss_index_k_start;
  float *i_arr;
  int i;
  float e_c1_p4;
  float e_c1_p3;
  float e_c1_p2;
  float e_c1_p1;
  float e_c1_m1;
  float e_c1_m2;
  float e_c1_m3;
  float e_c1_m4;
  float e_c0_p4;
  float e_c0_p3;
  float e_c0_p2;
  float e_c0_p1;
  float e_c0_m1;
  float e_c0_m2;
  float e_c0_m3;
  float e_c0_m4;
  float s11;
  float s10;
  float s9;
  float s8;
  float s7;
  float s6;
  float s5;
  float s4;
  float s3;
  float s2;
  float s1;
  float s0;
  __m256i sample_y_sub_int_scale_vec1;
  __m256i sample_y_sub_int_scale_vec0;
  int sample_y_sub_int_scale1;
  int sample_y_sub_int_scale0;
  int l_count1;
  int l_count;
  int l;
  __m256i sample_col2;
  __m256i sample_col0;
  __m256i sample_col1;
  __m256 ipoint_x_sub_int_scale_vec;
  __m256 kks2;
  __m256 kks1;
  __m256 kks0;
  int gauss_s2_index;
  float sum_of_squares;
  int desc_idx;
  float *descriptor;
  int height;
  int width;
  float ipoint_y_sub_int_scale_add_05;
  float ipoint_x_sub_int_scale_add_05;
  float ipoint_y_sub_int_scale;
  float ipoint_x_sub_int_scale;
  float ipoint_y;
  float ipoint_x;
  float g1_factor;
  float scale_squared;
  __m256 scale_vec;
  __m256i int_scale_vec;
  int int_scale;
  float scale;
  int local_654;
  int local_620;
  int local_61c;
  int local_614;
  int local_60c;
  float local_608;
  float local_604;
  float local_600;
  float local_5fc;
  float *local_5f8;
  int local_5ec;
  float *local_5e0;
  int local_5d4;
  int local_504;
  int local_41c;
  float local_418;
  int local_414;
  float local_340;
  float fStackY_33c;
  float fStackY_338;
  float fStackY_334;
  float fStackY_330;
  float fStackY_32c;
  float fStackY_328;
  float fStackY_324;
  float local_300;
  float fStackY_2fc;
  float fStackY_2f8;
  float fStackY_2f4;
  float fStackY_2f0;
  float fStackY_2ec;
  float fStackY_2e8;
  float fStackY_2e4;
  float local_2e0;
  float fStackY_2dc;
  float fStackY_2d8;
  float fStackY_2d4;
  float fStackY_2d0;
  float fStackY_2cc;
  float fStackY_2c8;
  float local_2c0;
  float fStackY_2bc;
  float fStackY_2b8;
  float fStackY_2b4;
  float fStackY_2b0;
  float fStackY_2ac;
  float fStackY_2a8;
  float fStackY_2a4;
  float local_200;
  float fStackY_1fc;
  float fStackY_1f8;
  float fStackY_1f4;
  float fStackY_1f0;
  float fStackY_1ec;
  float fStackY_1e8;
  float fStackY_1e4;
  undefined8 uVar75;
  undefined8 uVar76;
  longlong lVar77;
  float fVar78;
  float fVar79;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  fVar23 = in_RSI[2];
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar15._8_4_ = 0x3effffff;
  auVar15._0_8_ = 0x3effffff3effffff;
  auVar15._12_4_ = 0x3effffff;
  auVar10 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar23),auVar17,0xf8);
  auVar10 = vroundss_avx(ZEXT416((uint)fVar23),ZEXT416((uint)(fVar23 + auVar10._0_4_)),0xb);
  uVar5 = (uint)auVar10._0_4_;
  auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar10 = vpinsrd_avx(auVar10,uVar5,2);
  vpinsrd_avx(auVar10,uVar5,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
  auVar10 = vpinsrd_avx(auVar10,uVar5,2);
  vpinsrd_avx(auVar10,uVar5,3);
  auVar10 = vinsertps_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar23),0x20);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar23),0x30);
  auVar12 = vinsertps_avx(ZEXT416((uint)fVar23),ZEXT416((uint)fVar23),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar23),0x20);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar23),0x30);
  lVar77 = auVar12._0_8_;
  uVar75 = auVar10._0_8_;
  uVar76 = auVar10._8_8_;
  fVar20 = -0.08 / (fVar23 * fVar23);
  fVar78 = *in_RSI;
  auVar11 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar78),auVar17,0xf8);
  auVar11 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)(fVar78 + auVar11._0_4_)),0xb);
  auVar13._0_8_ = (double)auVar11._0_4_;
  auVar13._8_8_ = 0;
  auVar11._0_8_ = (double)fVar23;
  auVar11._8_8_ = 0;
  auVar13 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar11,auVar13);
  fVar78 = in_RSI[1];
  auVar11 = vpternlogd_avx512vl(auVar15,ZEXT416((uint)fVar78),auVar17,0xf8);
  auVar11 = vroundss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)(fVar78 + auVar11._0_4_)),0xb);
  auVar16._0_8_ = (double)auVar11._0_4_;
  auVar16._8_8_ = 0;
  auVar14._0_8_ = (double)fVar23;
  auVar14._8_8_ = 0;
  auVar11 = vfmadd213sd_fma(ZEXT816(0x3fe0000000000000),auVar14,auVar16);
  fVar78 = (float)auVar13._0_8_ - (float)(int)uVar5;
  fVar2 = (float)auVar11._0_8_ - (float)(int)uVar5;
  local_414 = 0;
  local_418 = 0.0;
  local_41c = 0;
  local_2c0 = (float)kk0_inner_arrays_simd._0_8_;
  fStackY_2bc = SUB84(kk0_inner_arrays_simd._0_8_,4);
  fStackY_2b8 = (float)kk0_inner_arrays_simd._8_8_;
  fStackY_2b4 = SUB84(kk0_inner_arrays_simd._8_8_,4);
  fStackY_2b0 = (float)kk0_inner_arrays_simd._16_8_;
  fStackY_2ac = SUB84(kk0_inner_arrays_simd._16_8_,4);
  fStackY_2a8 = (float)kk0_inner_arrays_simd._24_8_;
  fStackY_2a4 = SUB84(kk0_inner_arrays_simd._24_8_,4);
  local_2e0 = auVar10._0_4_;
  fStackY_2dc = auVar10._4_4_;
  fStackY_2d8 = auVar10._8_4_;
  fStackY_2d4 = auVar10._12_4_;
  fStackY_2d0 = auVar12._0_4_;
  fStackY_2cc = auVar12._4_4_;
  fStackY_2c8 = auVar12._8_4_;
  local_300 = (float)kk1_inner_arrays_simd._0_8_;
  fStackY_2fc = SUB84(kk1_inner_arrays_simd._0_8_,4);
  fStackY_2f8 = (float)kk1_inner_arrays_simd._8_8_;
  fStackY_2f4 = SUB84(kk1_inner_arrays_simd._8_8_,4);
  fStackY_2f0 = (float)kk1_inner_arrays_simd._16_8_;
  fStackY_2ec = SUB84(kk1_inner_arrays_simd._16_8_,4);
  fStackY_2e8 = (float)kk1_inner_arrays_simd._24_8_;
  fStackY_2e4 = SUB84(kk1_inner_arrays_simd._24_8_,4);
  local_340 = (float)kk2_inner_arrays_simd._0_8_;
  fStackY_33c = SUB84(kk2_inner_arrays_simd._0_8_,4);
  fStackY_338 = (float)kk2_inner_arrays_simd._8_8_;
  fStackY_334 = SUB84(kk2_inner_arrays_simd._8_8_,4);
  fStackY_330 = (float)kk2_inner_arrays_simd._16_8_;
  fStackY_32c = SUB84(kk2_inner_arrays_simd._16_8_,4);
  fStackY_328 = (float)kk2_inner_arrays_simd._24_8_;
  fStackY_324 = SUB84(kk2_inner_arrays_simd._24_8_,4);
  auVar10 = vinsertps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0x10);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar78),0x20);
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)fVar78),0x30);
  auVar12 = vinsertps_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar78),0x10);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar78),0x20);
  auVar12 = vinsertps_avx(auVar12,ZEXT416((uint)fVar78),0x30);
  local_200 = auVar12._0_4_;
  fStackY_1fc = auVar12._4_4_;
  fStackY_1f8 = auVar12._8_4_;
  fStackY_1f4 = auVar12._12_4_;
  fStackY_1f0 = auVar10._0_4_;
  fStackY_1ec = auVar10._4_4_;
  fStackY_1e8 = auVar10._8_4_;
  fStackY_1e4 = auVar10._12_4_;
  fVar21 = local_200 + local_300 * local_2e0;
  fVar37 = fStackY_1fc + fStackY_2fc * fStackY_2dc;
  fVar39 = fStackY_1f8 + fStackY_2f8 * fStackY_2d8;
  fVar41 = fStackY_1f4 + fStackY_2f4 * fStackY_2d4;
  fVar43 = fStackY_1f0 + fStackY_2f0 * fStackY_2d0;
  fVar45 = fStackY_1ec + fStackY_2ec * fStackY_2cc;
  fVar47 = fStackY_1e8 + fStackY_2e8 * fStackY_2c8;
  fStackY_2e4 = fStackY_1e4 + fStackY_2e4;
  auVar4._4_4_ = fVar37;
  auVar4._0_4_ = fVar21;
  auVar4._8_4_ = fVar39;
  auVar4._12_4_ = fVar41;
  auVar4._16_4_ = fVar43;
  auVar4._20_4_ = fVar45;
  auVar4._24_4_ = fVar47;
  auVar4._28_4_ = fStackY_2e4;
  vcvtps2dq_avx(auVar4);
  fVar22 = local_200 + local_2c0 * local_2e0;
  fVar38 = fStackY_1fc + fStackY_2bc * fStackY_2dc;
  fVar40 = fStackY_1f8 + fStackY_2b8 * fStackY_2d8;
  fVar42 = fStackY_1f4 + fStackY_2b4 * fStackY_2d4;
  fVar44 = fStackY_1f0 + fStackY_2b0 * fStackY_2d0;
  fVar46 = fStackY_1ec + fStackY_2ac * fStackY_2cc;
  fVar48 = fStackY_1e8 + fStackY_2a8 * fStackY_2c8;
  fStackY_2a4 = fStackY_1e4 + fStackY_2a4;
  auVar3._4_4_ = fVar38;
  auVar3._0_4_ = fVar22;
  auVar3._8_4_ = fVar40;
  auVar3._12_4_ = fVar42;
  auVar3._16_4_ = fVar44;
  auVar3._20_4_ = fVar46;
  auVar3._24_4_ = fVar48;
  auVar3._28_4_ = fStackY_2a4;
  vcvtps2dq_avx(auVar3);
  fStackY_1f8 = fStackY_1f8 + fStackY_338 * fStackY_2d8;
  fStackY_1f4 = fStackY_1f4 + fStackY_334 * fStackY_2d4;
  fStackY_1f0 = fStackY_1f0 + fStackY_330 * fStackY_2d0;
  fStackY_1ec = fStackY_1ec + fStackY_32c * fStackY_2cc;
  fStackY_1e8 = fStackY_1e8 + fStackY_328 * fStackY_2c8;
  fStackY_1e4 = fStackY_1e4 + fStackY_324;
  auVar1._4_4_ = fStackY_1fc + fStackY_33c * fStackY_2dc;
  auVar1._0_4_ = local_200 + local_340 * local_2e0;
  auVar1._8_4_ = fStackY_1f8;
  auVar1._12_4_ = fStackY_1f4;
  auVar1._16_4_ = fStackY_1f0;
  auVar1._20_4_ = fStackY_1ec;
  auVar1._24_4_ = fStackY_1e8;
  auVar1._28_4_ = fStackY_1e4;
  auVar1 = vcvtps2dq_avx(auVar1);
  auVar36 = ZEXT3264(auVar1);
  fVar78 = fVar23;
  fVar79 = fVar23;
  for (local_504 = -0xc; local_504 < 0xc; local_504 = local_504 + 4) {
    auVar10._0_4_ = (float)local_504;
    auVar10._4_12_ = auVar36._4_12_;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar23),auVar10,ZEXT416((uint)fVar2));
    auVar19._8_4_ = 0x80000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar19._12_4_ = 0x80000000;
    auVar18._8_4_ = 0x3effffff;
    auVar18._0_8_ = 0x3effffff3effffff;
    auVar18._12_4_ = 0x3effffff;
    auVar12 = vpternlogd_avx512vl(auVar18,auVar10,auVar19,0xf8);
    auVar10 = vroundss_avx(auVar10,ZEXT416((uint)(auVar10._0_4_ + auVar12._0_4_)),0xb);
    uVar5 = (uint)auVar10._0_4_;
    auVar12._0_4_ = (float)(local_504 + 1);
    auVar12._4_12_ = auVar10._4_12_;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar23),auVar12,ZEXT416((uint)fVar2));
    auVar12 = vpternlogd_avx512vl(auVar18,auVar10,auVar19,0xf8);
    auVar10 = vroundss_avx(auVar10,ZEXT416((uint)(auVar10._0_4_ + auVar12._0_4_)),0xb);
    uVar6 = (uint)auVar10._0_4_;
    auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar10 = vpinsrd_avx(auVar10,uVar5,2);
    vpinsrd_avx(auVar10,uVar5,3);
    auVar10 = vpinsrd_avx(ZEXT416(uVar5),uVar5,1);
    auVar10 = vpinsrd_avx(auVar10,uVar5,2);
    vpinsrd_avx(auVar10,uVar5,3);
    auVar10 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
    auVar10 = vpinsrd_avx(auVar10,uVar6,2);
    auVar10 = vpinsrd_avx(auVar10,uVar6,3);
    auVar12 = vpinsrd_avx(ZEXT416(uVar6),uVar6,1);
    auVar12 = vpinsrd_avx(auVar12,uVar6,2);
    auVar12 = vpinsrd_avx(auVar12,uVar6,3);
    auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10;
    uStack_70 = auVar11._0_8_;
    uStack_68 = auVar11._8_8_;
    row[0]._4_4_ = fStackY_2e4;
    row[0]._0_4_ = fVar47;
    row[1] = uVar75;
    row[2] = uVar76;
    row[3] = lVar77;
    col[0]._4_4_ = fStackY_2a4;
    col[0]._0_4_ = fVar48;
    col[1]._0_4_ = fVar21;
    col[1]._4_4_ = fVar37;
    col[2]._0_4_ = fVar39;
    col[2]._4_4_ = fVar41;
    col[3]._0_4_ = fVar43;
    col[3]._4_4_ = fVar45;
    scale_00[0]._4_4_ = fStackY_1e4;
    scale_00[0]._0_4_ = fStackY_1e8;
    scale_00[1]._0_4_ = fVar22;
    scale_00[1]._4_4_ = fVar38;
    scale_00[2]._0_4_ = fVar40;
    scale_00[2]._4_4_ = fVar42;
    scale_00[3]._0_4_ = fVar44;
    scale_00[3]._4_4_ = fVar46;
    haarXY_unconditional_vectorized
              ((integral_image *)CONCAT44(fVar79,fVar78),row,col,scale_00,
               (float *)CONCAT44(fStackY_1ec,fStackY_1f0),(float *)CONCAT44(fStackY_1f4,fStackY_1f8)
              );
    row_00[0]._4_4_ = fStackY_2e4;
    row_00[0]._0_4_ = fVar47;
    row_00[1] = uVar75;
    row_00[2] = uVar76;
    row_00[3] = lVar77;
    col_00[0]._4_4_ = fStackY_2a4;
    col_00[0]._0_4_ = fVar48;
    col_00[1]._0_4_ = fVar21;
    col_00[1]._4_4_ = fVar37;
    col_00[2]._0_4_ = fVar39;
    col_00[2]._4_4_ = fVar41;
    col_00[3]._0_4_ = fVar43;
    col_00[3]._4_4_ = fVar45;
    scale_01[0]._4_4_ = fStackY_1e4;
    scale_01[0]._0_4_ = fStackY_1e8;
    scale_01[1]._0_4_ = fVar22;
    scale_01[1]._4_4_ = fVar38;
    scale_01[2]._0_4_ = fVar40;
    scale_01[2]._4_4_ = fVar42;
    scale_01[3]._0_4_ = fVar44;
    scale_01[3]._4_4_ = fVar46;
    haarXY_unconditional_vectorized
              ((integral_image *)CONCAT44(fVar79,fVar78),row_00,col_00,scale_01,
               (float *)CONCAT44(fStackY_1ec,fStackY_1f0),(float *)CONCAT44(fStackY_1f4,fStackY_1f8)
              );
    row_01[0]._4_4_ = fStackY_2e4;
    row_01[0]._0_4_ = fVar47;
    row_01[1] = uVar75;
    row_01[2] = uVar76;
    row_01[3] = lVar77;
    col_01[0]._4_4_ = fStackY_2a4;
    col_01[0]._0_4_ = fVar48;
    col_01[1]._0_4_ = fVar21;
    col_01[1]._4_4_ = fVar37;
    col_01[2]._0_4_ = fVar39;
    col_01[2]._4_4_ = fVar41;
    col_01[3]._0_4_ = fVar43;
    col_01[3]._4_4_ = fVar45;
    scale_02[0]._4_4_ = fStackY_1e4;
    scale_02[0]._0_4_ = fStackY_1e8;
    scale_02[1]._0_4_ = fVar22;
    scale_02[1]._4_4_ = fVar38;
    scale_02[2]._0_4_ = fVar40;
    scale_02[2]._4_4_ = fVar42;
    scale_02[3]._0_4_ = fVar44;
    scale_02[3]._4_4_ = fVar46;
    haarXY_unconditional_vectorized
              ((integral_image *)CONCAT44(fVar79,fVar78),row_01,col_01,scale_02,
               (float *)CONCAT44(fStackY_1ec,fStackY_1f0),(float *)CONCAT44(fStackY_1f4,fStackY_1f8)
              );
    row_02[0]._4_4_ = fStackY_2e4;
    row_02[0]._0_4_ = fVar47;
    row_02[1] = uVar75;
    row_02[2] = uVar76;
    row_02[3] = lVar77;
    col_02[0]._4_4_ = fStackY_2a4;
    col_02[0]._0_4_ = fVar48;
    col_02[1]._0_4_ = fVar21;
    col_02[1]._4_4_ = fVar37;
    col_02[2]._0_4_ = fVar39;
    col_02[2]._4_4_ = fVar41;
    col_02[3]._0_4_ = fVar43;
    col_02[3]._4_4_ = fVar45;
    scale_03[0]._4_4_ = fStackY_1e4;
    scale_03[0]._0_4_ = fStackY_1e8;
    scale_03[1]._0_4_ = fVar22;
    scale_03[1]._4_4_ = fVar38;
    scale_03[2]._0_4_ = fVar40;
    scale_03[2]._4_4_ = fVar42;
    scale_03[3]._0_4_ = fVar44;
    scale_03[3]._4_4_ = fVar46;
    haarXY_unconditional_vectorized
              ((integral_image *)CONCAT44(fVar79,fVar78),row_02,col_02,scale_03,
               (float *)CONCAT44(fStackY_1ec,fStackY_1f0),(float *)CONCAT44(fStackY_1f4,fStackY_1f8)
              );
    row_03[0]._4_4_ = fStackY_2e4;
    row_03[0]._0_4_ = fVar47;
    row_03[1] = uVar75;
    row_03[2] = uVar76;
    row_03[3] = lVar77;
    col_03[0]._4_4_ = fStackY_2a4;
    col_03[0]._0_4_ = fVar48;
    col_03[1]._0_4_ = fVar21;
    col_03[1]._4_4_ = fVar37;
    col_03[2]._0_4_ = fVar39;
    col_03[2]._4_4_ = fVar41;
    col_03[3]._0_4_ = fVar43;
    col_03[3]._4_4_ = fVar45;
    scale_04[0]._4_4_ = fStackY_1e4;
    scale_04[0]._0_4_ = fStackY_1e8;
    scale_04[1]._0_4_ = fVar22;
    scale_04[1]._4_4_ = fVar38;
    scale_04[2]._0_4_ = fVar40;
    scale_04[2]._4_4_ = fVar42;
    scale_04[3]._0_4_ = fVar44;
    scale_04[3]._4_4_ = fVar46;
    haarXY_unconditional_vectorized
              ((integral_image *)CONCAT44(fVar79,fVar78),row_03,col_03,scale_04,
               (float *)CONCAT44(fStackY_1ec,fStackY_1f0),(float *)CONCAT44(fStackY_1f4,fStackY_1f8)
              );
    auVar36 = ZEXT3264(CONCAT824(uStack_68,
                                 CONCAT816(uStack_70,ZEXT116(0) * auVar10 + ZEXT116(1) * auVar12)));
    row_04[0]._4_4_ = fStackY_2e4;
    row_04[0]._0_4_ = fVar47;
    row_04[1] = uVar75;
    row_04[2] = uVar76;
    row_04[3] = lVar77;
    col_04[0]._4_4_ = fStackY_2a4;
    col_04[0]._0_4_ = fVar48;
    col_04[1]._0_4_ = fVar21;
    col_04[1]._4_4_ = fVar37;
    col_04[2]._0_4_ = fVar39;
    col_04[2]._4_4_ = fVar41;
    col_04[3]._0_4_ = fVar43;
    col_04[3]._4_4_ = fVar45;
    scale_05[0]._4_4_ = fStackY_1e4;
    scale_05[0]._0_4_ = fStackY_1e8;
    scale_05[1]._0_4_ = fVar22;
    scale_05[1]._4_4_ = fVar38;
    scale_05[2]._0_4_ = fVar40;
    scale_05[2]._4_4_ = fVar42;
    scale_05[3]._0_4_ = fVar44;
    scale_05[3]._4_4_ = fVar46;
    haarXY_unconditional_vectorized
              ((integral_image *)CONCAT44(fVar79,fVar78),row_04,col_04,scale_05,
               (float *)CONCAT44(fStackY_1ec,fStackY_1f0),(float *)CONCAT44(fStackY_1f4,fStackY_1f8)
              );
  }
  auVar24._4_12_ = SUB1612(ZEXT816(0x3fe0000000000000),4);
  auVar24._0_4_ = fVar23 * 0.5;
  auVar63._8_4_ = 0x80000000;
  auVar63._0_8_ = 0x8000000080000000;
  auVar63._12_4_ = 0x80000000;
  auVar49._8_4_ = 0x3effffff;
  auVar49._0_8_ = 0x3effffff3effffff;
  auVar49._12_4_ = 0x3effffff;
  auVar10 = vpternlogd_avx512vl(auVar49,auVar24,auVar63,0xf8);
  auVar10 = vroundss_avx(auVar24,ZEXT416((uint)(fVar23 * 0.5 + auVar10._0_4_)),0xb);
  auVar25._4_12_ = SUB1612(ZEXT816(0x3ff8000000000000),4);
  auVar25._0_4_ = fVar23 * 1.5;
  auVar64._8_4_ = 0x80000000;
  auVar64._0_8_ = 0x8000000080000000;
  auVar64._12_4_ = 0x80000000;
  auVar50._8_4_ = 0x3effffff;
  auVar50._0_8_ = 0x3effffff3effffff;
  auVar50._12_4_ = 0x3effffff;
  auVar12 = vpternlogd_avx512vl(auVar50,auVar25,auVar64,0xf8);
  auVar12 = vroundss_avx(auVar25,ZEXT416((uint)(fVar23 * 1.5 + auVar12._0_4_)),0xb);
  auVar26._4_12_ = SUB1612(ZEXT816(0x4004000000000000),4);
  auVar26._0_4_ = fVar23 * 2.5;
  auVar65._8_4_ = 0x80000000;
  auVar65._0_8_ = 0x8000000080000000;
  auVar65._12_4_ = 0x80000000;
  auVar51._8_4_ = 0x3effffff;
  auVar51._0_8_ = 0x3effffff3effffff;
  auVar51._12_4_ = 0x3effffff;
  auVar11 = vpternlogd_avx512vl(auVar51,auVar26,auVar65,0xf8);
  auVar11 = vroundss_avx(auVar26,ZEXT416((uint)(fVar23 * 2.5 + auVar11._0_4_)),0xb);
  fVar38 = auVar11._0_4_;
  auVar27._4_12_ = SUB1612(ZEXT816(0x400c000000000000),4);
  auVar27._0_4_ = fVar23 * 3.5;
  auVar66._8_4_ = 0x80000000;
  auVar66._0_8_ = 0x8000000080000000;
  auVar66._12_4_ = 0x80000000;
  auVar52._8_4_ = 0x3effffff;
  auVar52._0_8_ = 0x3effffff3effffff;
  auVar52._12_4_ = 0x3effffff;
  auVar11 = vpternlogd_avx512vl(auVar52,auVar27,auVar66,0xf8);
  auVar11 = vroundss_avx(auVar27,ZEXT416((uint)(fVar23 * 3.5 + auVar11._0_4_)),0xb);
  auVar28._4_12_ = SUB1612(ZEXT816(0x4012000000000000),4);
  auVar28._0_4_ = fVar23 * 4.5;
  auVar67._8_4_ = 0x80000000;
  auVar67._0_8_ = 0x8000000080000000;
  auVar67._12_4_ = 0x80000000;
  auVar53._8_4_ = 0x3effffff;
  auVar53._0_8_ = 0x3effffff3effffff;
  auVar53._12_4_ = 0x3effffff;
  auVar13 = vpternlogd_avx512vl(auVar53,auVar28,auVar67,0xf8);
  auVar13 = vroundss_avx(auVar28,ZEXT416((uint)(fVar23 * 4.5 + auVar13._0_4_)),0xb);
  auVar29._4_12_ = SUB1612(ZEXT816(0x4016000000000000),4);
  auVar29._0_4_ = fVar23 * 5.5;
  auVar68._8_4_ = 0x80000000;
  auVar68._0_8_ = 0x8000000080000000;
  auVar68._12_4_ = 0x80000000;
  auVar54._8_4_ = 0x3effffff;
  auVar54._0_8_ = 0x3effffff3effffff;
  auVar54._12_4_ = 0x3effffff;
  auVar14 = vpternlogd_avx512vl(auVar54,auVar29,auVar68,0xf8);
  auVar14 = vroundss_avx(auVar29,ZEXT416((uint)(fVar23 * 5.5 + auVar14._0_4_)),0xb);
  auVar30._4_12_ = SUB1612(ZEXT816(0x401a000000000000),4);
  auVar30._0_4_ = fVar23 * 6.5;
  auVar69._8_4_ = 0x80000000;
  auVar69._0_8_ = 0x8000000080000000;
  auVar69._12_4_ = 0x80000000;
  auVar55._8_4_ = 0x3effffff;
  auVar55._0_8_ = 0x3effffff3effffff;
  auVar55._12_4_ = 0x3effffff;
  auVar15 = vpternlogd_avx512vl(auVar55,auVar30,auVar69,0xf8);
  auVar15 = vroundss_avx(auVar30,ZEXT416((uint)(fVar23 * 6.5 + auVar15._0_4_)),0xb);
  auVar31._4_12_ = SUB1612(ZEXT816(0x401e000000000000),4);
  auVar31._0_4_ = fVar23 * 7.5;
  auVar70._8_4_ = 0x80000000;
  auVar70._0_8_ = 0x8000000080000000;
  auVar70._12_4_ = 0x80000000;
  auVar56._8_4_ = 0x3effffff;
  auVar56._0_8_ = 0x3effffff3effffff;
  auVar56._12_4_ = 0x3effffff;
  auVar16 = vpternlogd_avx512vl(auVar56,auVar31,auVar70,0xf8);
  auVar16 = vroundss_avx(auVar31,ZEXT416((uint)(fVar23 * 7.5 + auVar16._0_4_)),0xb);
  fVar46 = auVar16._0_4_;
  auVar32._4_12_ = SUB1612(ZEXT816(0x4021000000000000),4);
  auVar32._0_4_ = fVar23 * 8.5;
  auVar71._8_4_ = 0x80000000;
  auVar71._0_8_ = 0x8000000080000000;
  auVar71._12_4_ = 0x80000000;
  auVar57._8_4_ = 0x3effffff;
  auVar57._0_8_ = 0x3effffff3effffff;
  auVar57._12_4_ = 0x3effffff;
  auVar16 = vpternlogd_avx512vl(auVar57,auVar32,auVar71,0xf8);
  auVar16 = vroundss_avx(auVar32,ZEXT416((uint)(fVar23 * 8.5 + auVar16._0_4_)),0xb);
  auVar33._4_12_ = SUB1612(ZEXT816(0x4023000000000000),4);
  auVar33._0_4_ = fVar23 * 9.5;
  auVar72._8_4_ = 0x80000000;
  auVar72._0_8_ = 0x8000000080000000;
  auVar72._12_4_ = 0x80000000;
  auVar58._8_4_ = 0x3effffff;
  auVar58._0_8_ = 0x3effffff3effffff;
  auVar58._12_4_ = 0x3effffff;
  auVar17 = vpternlogd_avx512vl(auVar58,auVar33,auVar72,0xf8);
  auVar17 = vroundss_avx(auVar33,ZEXT416((uint)(fVar23 * 9.5 + auVar17._0_4_)),0xb);
  auVar34._4_12_ = SUB1612(ZEXT816(0x4025000000000000),4);
  auVar34._0_4_ = fVar23 * 10.5;
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar59._8_4_ = 0x3effffff;
  auVar59._0_8_ = 0x3effffff3effffff;
  auVar59._12_4_ = 0x3effffff;
  auVar18 = vpternlogd_avx512vl(auVar59,auVar34,auVar73,0xf8);
  auVar18 = vroundss_avx(auVar34,ZEXT416((uint)(fVar23 * 10.5 + auVar18._0_4_)),0xb);
  auVar35._4_12_ = SUB1612(ZEXT816(0x4027000000000000),4);
  auVar35._0_4_ = fVar23 * 11.5;
  auVar74._8_4_ = 0x80000000;
  auVar74._0_8_ = 0x8000000080000000;
  auVar74._12_4_ = 0x80000000;
  auVar60._8_4_ = 0x3effffff;
  auVar60._0_8_ = 0x3effffff3effffff;
  auVar60._12_4_ = 0x3effffff;
  auVar19 = vpternlogd_avx512vl(auVar60,auVar35,auVar74,0xf8);
  auVar19 = vroundss_avx(auVar35,ZEXT416((uint)(fVar23 * 11.5 + auVar19._0_4_)),0xb);
  fVar23 = fVar38 + auVar12._0_4_;
  fVar78 = fVar38 + auVar10._0_4_;
  fVar2 = fVar38 - auVar10._0_4_;
  fVar79 = fVar38 - auVar12._0_4_;
  fVar21 = fVar38 - auVar11._0_4_;
  fVar22 = fVar38 - auVar13._0_4_;
  fVar37 = fVar38 - auVar14._0_4_;
  fVar38 = fVar38 - auVar15._0_4_;
  fVar39 = fVar46 - auVar11._0_4_;
  fVar40 = fVar46 - auVar13._0_4_;
  fVar41 = fVar46 - auVar14._0_4_;
  fVar42 = fVar46 - auVar15._0_4_;
  fVar43 = fVar46 - auVar16._0_4_;
  fVar44 = fVar46 - auVar17._0_4_;
  fVar45 = fVar46 - auVar18._0_4_;
  fVar46 = fVar46 - auVar19._0_4_;
  gauss_s1_c0[0] = expf(fVar20 * fVar23 * fVar23);
  gauss_s1_c0[1] = expf(fVar20 * fVar78 * fVar78);
  gauss_s1_c0[2] = expf(fVar20 * fVar2 * fVar2);
  gauss_s1_c0[3] = expf(fVar20 * fVar79 * fVar79);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar20 * fVar21 * fVar21);
  gauss_s1_c0[6] = expf(fVar20 * fVar22 * fVar22);
  gauss_s1_c0[7] = expf(fVar20 * fVar37 * fVar37);
  gauss_s1_c0[8] = expf(fVar20 * fVar38 * fVar38);
  gauss_s1_c1[0] = expf(fVar20 * fVar39 * fVar39);
  gauss_s1_c1[1] = expf(fVar20 * fVar40 * fVar40);
  gauss_s1_c1[2] = expf(fVar20 * fVar41 * fVar41);
  gauss_s1_c1[3] = expf(fVar20 * fVar42 * fVar42);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar20 * fVar43 * fVar43);
  gauss_s1_c1[6] = expf(fVar20 * fVar44 * fVar44);
  gauss_s1_c1[7] = expf(fVar20 * fVar45 * fVar45);
  gauss_s1_c1[8] = expf(fVar20 * fVar46 * fVar46);
  for (local_5d4 = -8; local_5d4 < 8; local_5d4 = local_5d4 + 5) {
    if ((local_5d4 == -8) || (local_5d4 == 7)) {
      local_5e0 = gauss_s1_c1;
    }
    else {
      local_5e0 = gauss_s1_c0;
    }
    iVar7 = 0;
    if (local_5d4 < 0) {
      iVar7 = 8;
    }
    iVar8 = 1;
    if (local_5d4 < 0) {
      iVar8 = -1;
    }
    for (local_5ec = -8; local_5ec < 8; local_5ec = local_5ec + 5) {
      if ((local_5ec == -8) || (local_5ec == 7)) {
        local_5f8 = gauss_s1_c1;
      }
      else {
        local_5f8 = gauss_s1_c0;
      }
      local_5fc = 0.0;
      local_600 = 0.0;
      local_604 = 0.0;
      local_608 = 0.0;
      local_60c = 0;
      if (local_5ec < 0) {
        local_60c = 8;
      }
      iVar9 = 1;
      if (local_5ec < 0) {
        iVar9 = -1;
      }
      for (local_614 = (local_5ec + 8) * 0x18;
          SBORROW4(local_614,(local_5ec + 0x11) * 0x18) !=
          local_614 + (local_5ec + 0x11) * -0x18 < 0; local_614 = local_614 + 0x18) {
        local_61c = iVar7;
        for (local_620 = local_5d4 + 8; local_620 < local_5d4 + 0x11; local_620 = local_620 + 1) {
          fVar23 = local_5e0[local_61c] * local_5f8[local_60c] *
                   haarResponseY[local_614 + local_620];
          fVar78 = local_5e0[local_61c] * local_5f8[local_60c] *
                   haarResponseX[local_614 + local_620];
          local_5fc = fVar23 + local_5fc;
          local_600 = fVar78 + local_600;
          auVar61._8_4_ = 0x7fffffff;
          auVar61._0_8_ = 0x7fffffff7fffffff;
          auVar61._12_4_ = 0x7fffffff;
          auVar10 = vpand_avx(ZEXT416((uint)fVar23),auVar61);
          local_604 = auVar10._0_4_ + local_604;
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          auVar10 = vpand_avx(ZEXT416((uint)fVar78),auVar62);
          local_608 = auVar10._0_4_ + local_608;
          local_61c = iVar8 + local_61c;
        }
        local_60c = iVar9 + local_60c;
      }
      fVar23 = gauss_s2_arr[local_41c];
      local_41c = local_41c + 1;
      local_5fc = local_5fc * fVar23;
      local_600 = local_600 * fVar23;
      local_604 = local_604 * fVar23;
      local_608 = local_608 * fVar23;
      in_RSI[(long)local_414 + 5] = local_5fc;
      in_RSI[(long)(local_414 + 1) + 5] = local_600;
      in_RSI[(long)(local_414 + 2) + 5] = local_604;
      in_RSI[(long)(local_414 + 3) + 5] = local_608;
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)local_5fc),ZEXT416((uint)local_5fc),
                                ZEXT416((uint)(local_600 * local_600)));
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)local_604),ZEXT416((uint)local_604),auVar10);
      auVar10 = vfmadd213ss_fma(ZEXT416((uint)local_608),ZEXT416((uint)local_608),auVar10);
      local_418 = auVar10._0_4_ + local_418;
      local_414 = local_414 + 4;
    }
  }
  fVar23 = sqrtf(local_418);
  for (local_654 = 0; local_654 < 0x40; local_654 = local_654 + 1) {
    in_RSI[(long)local_654 + 5] = (1.0 / fVar23) * in_RSI[(long)local_654 + 5];
  }
  return;
}

Assistant:

void get_msurf_descriptor_simd_2_24_unconditional(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);

    __m256i int_scale_vec = _mm256_set1_epi32(int_scale);
    __m256 scale_vec = _mm256_set1_ps(scale);

    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    // check if we ever hit a boundary
   
        __m256 kks0 = _mm256_mul_ps(kk0_inner_arrays_simd, scale_vec);
        __m256 kks1 = _mm256_mul_ps(kk1_inner_arrays_simd, scale_vec);
        __m256 kks2 = _mm256_mul_ps(kk2_inner_arrays_simd, scale_vec);

        __m256 ipoint_x_sub_int_scale_vec = _mm256_set1_ps((float) ipoint_x_sub_int_scale);

        // USE CVTTPS_EPI32 FOR TRUNCATION!!!
        __m256i sample_col1 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks1));
        __m256i sample_col0 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks0));
        __m256i sample_col2 = _mm256_cvtps_epi32(_mm256_add_ps(ipoint_x_sub_int_scale_vec, kks2));

        for (int l=-12, l_count=0; l<12; l+=4, l_count+=4) {

            int l_count1 = l_count + 1;

            int sample_y_sub_int_scale0 = (int) roundf(ipoint_y_sub_int_scale + l * scale);
            int sample_y_sub_int_scale1 = (int) roundf(ipoint_y_sub_int_scale + (l+1) * scale);  

            __m256i sample_y_sub_int_scale_vec0 = _mm256_set1_epi32(sample_y_sub_int_scale0);
            __m256i sample_y_sub_int_scale_vec1 = _mm256_set1_epi32(sample_y_sub_int_scale1);
            
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col0, int_scale_vec, &haarResponseX[l_count*24+0], &haarResponseY[l_count*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col0, int_scale_vec, &haarResponseX[l_count1*24+0], &haarResponseY[l_count1*24+0]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col1, int_scale_vec, &haarResponseX[l_count*24+8], &haarResponseY[l_count*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col1, int_scale_vec, &haarResponseX[l_count1*24+8], &haarResponseY[l_count1*24+8]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec0, sample_col2, int_scale_vec, &haarResponseX[l_count*24+16], &haarResponseY[l_count*24+16]);
            haarXY_unconditional_vectorized(iimage, sample_y_sub_int_scale_vec1, sample_col2, int_scale_vec, &haarResponseX[l_count1*24+16], &haarResponseY[l_count1*24+16]);
        }



    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));
    
    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}